

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

void __thiscall
vkt::anon_unknown_0::PixelValue::PixelValue
          (PixelValue *this,Maybe<bool> *x,Maybe<bool> *y,Maybe<bool> *z,Maybe<bool> *w)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  Maybe<bool> values [4];
  
  this->m_status = 0;
  values[0].m_ptr = (bool *)0x0;
  if (x != (Maybe<bool> *)0x0) {
    values[0].field_1.m_data[0] = *(deUint8 *)&x->m_ptr;
    values[0].m_ptr = (bool *)values[0].field_1.m_data;
  }
  values[1].m_ptr = (bool *)0x0;
  if (y != (Maybe<bool> *)0x0) {
    values[1].field_1.m_data[0] = *(deUint8 *)&y->m_ptr;
    values[1].m_ptr = (bool *)values[1].field_1.m_data;
  }
  values[2].m_ptr = (bool *)0x0;
  if (z != (Maybe<bool> *)0x0) {
    values[2].field_1.m_data[0] = *(deUint8 *)&z->m_ptr;
    values[2].m_ptr = (bool *)values[2].field_1.m_data;
  }
  values[3].m_ptr = (bool *)0x0;
  if (w != (Maybe<bool> *)0x0) {
    values[3].field_1.m_data[0] = *(deUint8 *)&w->m_ptr;
    values[3].m_ptr = (bool *)values[3].field_1.m_data;
  }
  lVar2 = 0;
  uVar1 = 0;
  do {
    if ((&values[0].m_ptr)[lVar2] == (bool *)0x0) {
      uVar1 = uVar1 & ~(1 << ((uint)lVar2 & 0x1f));
    }
    else {
      uVar3 = 2 << ((byte)lVar2 & 0x1f);
      uVar1 = uVar1 | 1 << ((uint)lVar2 & 0x1f);
      if (*(&values[0].m_ptr)[lVar2] == true) {
        uVar1 = uVar1 | uVar3;
      }
      else {
        uVar1 = uVar1 & ~uVar3;
      }
    }
    lVar2 = lVar2 + 2;
  } while (lVar2 != 8);
  this->m_status = (deUint16)uVar1;
  return;
}

Assistant:

PixelValue::PixelValue (const Maybe<bool>&	x,
						const Maybe<bool>&	y,
						const Maybe<bool>&	z,
						const Maybe<bool>&	w)
	: m_status (0)
{
	const Maybe<bool> values[] =
	{
		x, y, z, w
	};

	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(values); ndx++)
	{
		if (values[ndx])
			setValue(ndx, *values[ndx]);
		else
			setUndefined(ndx);
	}

	DE_ASSERT(m_status <= 0xFFu);
}